

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xts_test.cc
# Opt level: O0

void __thiscall XTSTest_TestVectors_Test::TestBody(XTSTest_TestVectors_Test *this)

{
  bool bVar1;
  EVP_CIPHER *cipher_00;
  char *pcVar2;
  const_iterator pbVar3;
  size_type sVar4;
  EVP_CIPHER_CTX *pEVar5;
  uchar *puVar6;
  uchar *puVar7;
  size_t sVar8;
  char *in_R9;
  AssertHelper local_628;
  Message local_620;
  Span<const_unsigned_char> local_618;
  Bytes local_608;
  Span<const_unsigned_char> local_5f8;
  Bytes local_5e8;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_5a8;
  Message local_5a0;
  int local_594;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_560;
  Message local_558;
  int local_54c;
  undefined1 local_548 [8];
  AssertionResult gtest_ar__6;
  uchar *local_530;
  pointer local_528;
  uchar *puStack_520;
  AssertHelper local_518;
  Message local_510;
  Span<const_unsigned_char> local_508;
  Bytes local_4f8;
  Span<const_unsigned_char> local_4e8;
  Bytes local_4d8;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_498;
  Message local_490;
  int local_484;
  undefined1 local_480 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_468 [4];
  int len;
  AssertHelper local_448;
  Message local_440;
  int local_434;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__4;
  ScopedEVP_CIPHER_CTX ctx;
  uchar *local_380;
  allocator<unsigned_char> local_371;
  undefined1 local_370 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  Span<const_unsigned_char> in;
  ScopedTrace gtest_trace_231;
  bool in_place;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_328;
  initializer_list<bool> *local_318;
  initializer_list<bool> *__range2;
  Message local_308;
  size_type local_300;
  size_type local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_2;
  Message local_2d8;
  size_type local_2d0;
  uint local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_1;
  Message local_2a8;
  size_type local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar;
  AssertHelper local_260;
  Message local_258;
  allocator<char> local_249;
  string local_248;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1f0;
  Message local_1e8;
  allocator<char> local_1d9;
  string local_1d8;
  bool local_1b1;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_180;
  Message local_178;
  allocator<char> local_169;
  string local_168;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__1;
  string local_128;
  AssertHelper local_108;
  Message local_100;
  allocator<char> local_f1;
  string local_f0;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> plaintext;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  EVP_CIPHER *cipher;
  XTSTestCase *pXStack_38;
  ScopedTrace gtest_trace_215;
  XTSTestCase *test;
  XTSTestCase *__end1;
  XTSTestCase *__begin1;
  XTSTestCase (*__range1) [5];
  XTSTest_TestVectors_Test *pXStack_10;
  uint test_num;
  XTSTest_TestVectors_Test *this_local;
  
  __range1._4_4_ = 0;
  __end1 = kXTSTestCases;
  pXStack_10 = this;
  do {
    if (__end1 == (XTSTestCase *)&vtable) {
      return;
    }
    pXStack_38 = __end1;
    __range1._4_4_ = __range1._4_4_ + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              ((ScopedTrace *)((long)&cipher + 7),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
               ,0xd7,(uint *)((long)&__range1 + 4));
    cipher_00 = EVP_aes_256_xts();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
    pcVar2 = pXStack_38->key_hex;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar2,&local_f1);
    local_c9 = DecodeHex((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&local_f0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_c8,&local_c9,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_100);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_128,(internal *)local_c8,(AssertionResult *)"DecodeHex(&key, test.key_hex)",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                 ,0xdc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      testing::Message::~Message(&local_100);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pcVar2 = pXStack_38->iv_hex;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar2,&local_169);
      local_141 = DecodeHex((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &plaintext.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_168);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_140,&local_141,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_140,
                   (AssertionResult *)"DecodeHex(&iv, test.iv_hex)","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                   ,0xdd,pcVar2);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_178);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pcVar2 = pXStack_38->plaintext_hex;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,pcVar2,&local_1d9);
        local_1b1 = DecodeHex((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &ciphertext.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d8);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1b0,&local_1b1,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::allocator<char>::~allocator(&local_1d9);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
        if (!bVar1) {
          testing::Message::Message(&local_1e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_1b0,
                     (AssertionResult *)"DecodeHex(&plaintext, test.plaintext_hex)","false","true",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                     ,0xde,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
          testing::internal::AssertHelper::~AssertHelper(&local_1f0);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_1e8);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pcVar2 = pXStack_38->ciphertext_hex;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar2,&local_249)
          ;
          local_221 = DecodeHex((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                &gtest_ar_.message_,&local_248);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_220,&local_221,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
          if (!bVar1) {
            testing::Message::Message(&local_258);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_220,
                       (AssertionResult *)"DecodeHex(&ciphertext, test.ciphertext_hex)","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_260,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                       ,0xdf,pcVar2);
            testing::internal::AssertHelper::operator=(&local_260,&local_258);
            testing::internal::AssertHelper::~AssertHelper(&local_260);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_258);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_294 = EVP_CIPHER_key_length(cipher_00);
            local_2a0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &iv.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                      ((EqHelper *)local_290,"EVP_CIPHER_key_length(cipher)","key.size()",&local_294
                       ,&local_2a0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
            if (!bVar1) {
              testing::Message::Message(&local_2a8);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                         ,0xe1,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_1.message_,&local_2a8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
              testing::Message::~Message(&local_2a8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_2c4 = EVP_CIPHER_iv_length(cipher_00);
              local_2d0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &plaintext.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                        ((EqHelper *)local_2c0,"EVP_CIPHER_iv_length(cipher)","iv.size()",&local_2c4
                         ,&local_2d0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
              if (!bVar1) {
                testing::Message::Message(&local_2d8);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                           ,0xe2,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_2.message_,&local_2d8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_)
                ;
                testing::Message::~Message(&local_2d8);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_2f8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &ciphertext.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                local_300 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &gtest_ar_.message_);
                testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                          ((EqHelper *)local_2f0,"plaintext.size()","ciphertext.size()",&local_2f8,
                           &local_300);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2f0);
                if (!bVar1) {
                  testing::Message::Message(&local_308);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&__range2,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                             ,0xe3,pcVar2);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&__range2,&local_308);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range2);
                  testing::Message::~Message(&local_308);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  __begin2._6_1_ = 0;
                  __begin2._7_1_ = 1;
                  local_328._M_array = (iterator)((long)&__begin2 + 6);
                  local_328._M_len = 2;
                  local_318 = &local_328;
                  __end2 = std::initializer_list<bool>::begin(local_318);
                  pbVar3 = std::initializer_list<bool>::end(local_318);
                  for (; __end2 != pbVar3; __end2 = __end2 + 1) {
                    in.size_._7_1_ = *__end2 & 1;
                    testing::ScopedTrace::ScopedTrace<bool>
                              ((ScopedTrace *)((long)&in.size_ + 6),
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                               ,0xe7,(bool *)((long)&in.size_ + 7));
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)
                               &out.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &ciphertext.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &ciphertext.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::allocator<unsigned_char>::allocator(&local_371);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_370,
                               sVar4,&local_371);
                    std::allocator<unsigned_char>::~allocator(&local_371);
                    if ((in.size_._7_1_ & 1) != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_370,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &ciphertext.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                      bssl::Span<unsigned_char_const>::
                      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                ((Span<unsigned_char_const> *)&ctx.ctx_.poisoned,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_370)
                      ;
                      out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)ctx.ctx_._144_8_;
                      in.data_ = local_380;
                    }
                    bssl::internal::
                    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                    ::StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                      *)&gtest_ar__4.message_);
                    pEVar5 = (EVP_CIPHER_CTX *)
                             bssl::internal::
                             StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                             ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                    *)&gtest_ar__4.message_);
                    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &iv.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &plaintext.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    local_434 = EVP_EncryptInit_ex(pEVar5,cipher_00,(ENGINE *)0x0,puVar6,puVar7);
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_430,&local_434,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_430);
                    if (!bVar1) {
                      testing::Message::Message(&local_440);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_468,(internal *)local_430,
                                 (AssertionResult *)
                                 "EVP_EncryptInit_ex(ctx.get(), cipher, nullptr, key.data(), iv.data())"
                                 ,"false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_448,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                                 ,0xf3,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_448,&local_440);
                      testing::internal::AssertHelper::~AssertHelper(&local_448);
                      std::__cxx11::string::~string((string *)local_468);
                      testing::Message::~Message(&local_440);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pEVar5 = (EVP_CIPHER_CTX *)
                               bssl::internal::
                               StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                               ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                      *)&gtest_ar__4.message_);
                      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          local_370);
                      puVar7 = bssl::Span<const_unsigned_char>::data
                                         ((Span<const_unsigned_char> *)
                                          &out.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      sVar8 = bssl::Span<const_unsigned_char>::size
                                        ((Span<const_unsigned_char> *)
                                         &out.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      local_484 = EVP_EncryptUpdate(pEVar5,puVar6,
                                                    (int *)((long)&gtest_ar__5.message_._M_t.
                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),puVar7,(int)sVar8);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_480,&local_484,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_480);
                      if (!bVar1) {
                        testing::Message::Message(&local_490);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar_3.message_,(internal *)local_480,
                                   (AssertionResult *)
                                   "EVP_EncryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size())"
                                   ,"false","true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_498,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                                   ,0xf6,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_498,&local_490);
                        testing::internal::AssertHelper::~AssertHelper(&local_498);
                        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                        testing::Message::~Message(&local_490);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_370,
                                   (long)gtest_ar__5.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_4e8,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &gtest_ar_.message_);
                        Bytes::Bytes(&local_4d8,local_4e8);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_508,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_370);
                        Bytes::Bytes(&local_4f8,local_508);
                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                  ((EqHelper *)local_4c8,"Bytes(ciphertext)","Bytes(out)",&local_4d8
                                   ,&local_4f8);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_4c8);
                        if (!bVar1) {
                          testing::Message::Message(&local_510);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_4c8);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_518,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                                     ,0xf8,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_518,&local_510);
                          testing::internal::AssertHelper::~AssertHelper(&local_518);
                          testing::Message::~Message(&local_510);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_528,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &gtest_ar_.message_);
                        out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = local_528;
                        in.data_ = puStack_520;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_370);
                        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &ciphertext.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_370,sVar4);
                        if ((in.size_._7_1_ & 1) != 0) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_370,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &gtest_ar_.message_);
                          bssl::Span<unsigned_char_const>::
                          Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                    ((Span<unsigned_char_const> *)&gtest_ar__6.message_,
                                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_370);
                          out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)gtest_ar__6.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl;
                          in.data_ = local_530;
                        }
                        bssl::internal::
                        StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                        ::Reset((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                 *)&gtest_ar__4.message_);
                        pEVar5 = (EVP_CIPHER_CTX *)
                                 bssl::internal::
                                 StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                 ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                        *)&gtest_ar__4.message_);
                        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&iv.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&plaintext.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        local_54c = EVP_DecryptInit_ex(pEVar5,cipher_00,(ENGINE *)0x0,puVar6,puVar7)
                        ;
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_548,&local_54c,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_548);
                        if (!bVar1) {
                          testing::Message::Message(&local_558);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar__7.message_,(internal *)local_548,
                                     (AssertionResult *)
                                     "EVP_DecryptInit_ex(ctx.get(), cipher, nullptr, key.data(), iv.data())"
                                     ,"false","true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_560,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                                     ,0x105,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_560,&local_558);
                          testing::internal::AssertHelper::~AssertHelper(&local_560);
                          std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                          testing::Message::~Message(&local_558);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          pEVar5 = (EVP_CIPHER_CTX *)
                                   bssl::internal::
                                   StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                   ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                          *)&gtest_ar__4.message_);
                          puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)local_370);
                          puVar7 = bssl::Span<const_unsigned_char>::data
                                             ((Span<const_unsigned_char> *)
                                              &out.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          sVar8 = bssl::Span<const_unsigned_char>::size
                                            ((Span<const_unsigned_char> *)
                                             &out.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          local_594 = EVP_DecryptUpdate(pEVar5,puVar6,
                                                        (int *)((long)&gtest_ar__5.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 4),puVar7,(int)sVar8);
                          testing::AssertionResult::AssertionResult<int>
                                    ((AssertionResult *)local_590,&local_594,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_590);
                          if (!bVar1) {
                            testing::Message::Message(&local_5a0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)&gtest_ar_4.message_,(internal *)local_590,
                                       (AssertionResult *)
                                       "EVP_DecryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size())"
                                       ,"false","true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_5a8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                                       ,0x107,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
                            testing::internal::AssertHelper::~AssertHelper(&local_5a8);
                            std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
                            testing::Message::~Message(&local_5a0);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_370,
                                       (long)gtest_ar__5.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._4_4_);
                            bssl::Span<unsigned_char_const>::
                            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ((Span<unsigned_char_const> *)&local_5f8,
                                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &ciphertext.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            Bytes::Bytes(&local_5e8,local_5f8);
                            bssl::Span<unsigned_char_const>::
                            Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                      ((Span<unsigned_char_const> *)&local_618,
                                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_370);
                            Bytes::Bytes(&local_608,local_618);
                            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                      ((EqHelper *)local_5d8,"Bytes(plaintext)","Bytes(out)",
                                       &local_5e8,&local_608);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_5d8);
                            if (!bVar1) {
                              testing::Message::Message(&local_620);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_5d8);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_628,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/xts/xts_test.cc"
                                         ,0x109,pcVar2);
                              testing::internal::AssertHelper::operator=(&local_628,&local_620);
                              testing::internal::AssertHelper::~AssertHelper(&local_628);
                              testing::Message::~Message(&local_620);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8)
                            ;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ = 0;
                          }
                        }
                      }
                    }
                    bssl::internal::
                    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                    ::~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                                       *)&gtest_ar__4.message_);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_370);
                    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&in.size_ + 6));
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ != 0) goto LAB_00131832;
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
LAB_00131832:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_.message_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &ciphertext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &plaintext.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&cipher + 7));
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) {
      return;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

TEST(XTSTest, TestVectors) {
  unsigned test_num = 0;
  for (const auto &test : kXTSTestCases) {
    test_num++;
    SCOPED_TRACE(test_num);

    const EVP_CIPHER *cipher = EVP_aes_256_xts();

    std::vector<uint8_t> key, iv, plaintext, ciphertext;
    ASSERT_TRUE(DecodeHex(&key, test.key_hex));
    ASSERT_TRUE(DecodeHex(&iv, test.iv_hex));
    ASSERT_TRUE(DecodeHex(&plaintext, test.plaintext_hex));
    ASSERT_TRUE(DecodeHex(&ciphertext, test.ciphertext_hex));

    ASSERT_EQ(EVP_CIPHER_key_length(cipher), key.size());
    ASSERT_EQ(EVP_CIPHER_iv_length(cipher), iv.size());
    ASSERT_EQ(plaintext.size(), ciphertext.size());

    // Note XTS doesn't support streaming, so we only test single-shot inputs.
    for (bool in_place : {false, true}) {
      SCOPED_TRACE(in_place);

      // Test encryption.
      bssl::Span<const uint8_t> in = plaintext;
      std::vector<uint8_t> out(plaintext.size());
      if (in_place) {
        out = plaintext;
        in = out;
      }

      bssl::ScopedEVP_CIPHER_CTX ctx;
      ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), cipher, nullptr, key.data(),
                                     iv.data()));
      int len;
      ASSERT_TRUE(
          EVP_EncryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size()));
      out.resize(len);
      EXPECT_EQ(Bytes(ciphertext), Bytes(out));

      // Test decryption.
      in = ciphertext;
      out.clear();
      out.resize(plaintext.size());
      if (in_place) {
        out = ciphertext;
        in = out;
      }

      ctx.Reset();
      ASSERT_TRUE(EVP_DecryptInit_ex(ctx.get(), cipher, nullptr, key.data(),
                                     iv.data()));
      ASSERT_TRUE(
          EVP_DecryptUpdate(ctx.get(), out.data(), &len, in.data(), in.size()));
      out.resize(len);
      EXPECT_EQ(Bytes(plaintext), Bytes(out));
    }
  }
}